

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::rejectLeave(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int leaveNum,SPxId leaveId,Status leaveStat,
             SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *param_4)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  Status **ppSVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  
  lVar6 = (long)leaveNum;
  if (leaveId.super_DataKey.info < 0) {
    ppSVar7 = &(this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thedesc.rowstat.data;
    if (leaveStat != D_ON_BOTH) goto LAB_00246481;
    bVar12 = (*ppSVar7)[lVar6] == P_ON_LOWER;
    lVar8 = 0x9b0;
    lVar11 = 0x9c8;
    lVar10 = 0x9c8;
  }
  else {
    ppSVar7 = &(this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thedesc.colstat.data;
    if (leaveStat != D_ON_BOTH) goto LAB_00246481;
    bVar12 = (*ppSVar7)[lVar6] == P_ON_UPPER;
    lVar8 = 0x9e0;
    lVar11 = 0x9f8;
    lVar10 = 0x9f8;
  }
  lVar9 = lVar8;
  if (bVar12) {
    lVar9 = lVar11;
    lVar10 = lVar8;
  }
  lVar10 = *(long *)((long)&(this->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .
                            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._vptr_ClassArray + lVar10);
  lVar11 = lVar6 * 0x38;
  lVar8 = *(long *)((long)&(this->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .
                           super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._vptr_ClassArray + lVar9);
  *(undefined8 *)(lVar8 + 0x20 + lVar11) = *(undefined8 *)(lVar10 + 0x20 + lVar11);
  uVar3 = *(undefined8 *)(lVar10 + lVar11);
  uVar4 = ((undefined8 *)(lVar10 + lVar11))[1];
  puVar1 = (undefined8 *)(lVar10 + 0x10 + lVar11);
  uVar5 = puVar1[1];
  puVar2 = (undefined8 *)(lVar8 + 0x10 + lVar11);
  *puVar2 = *puVar1;
  puVar2[1] = uVar5;
  *(undefined8 *)(lVar8 + lVar11) = uVar3;
  ((undefined8 *)(lVar8 + lVar11))[1] = uVar4;
  *(undefined4 *)(lVar8 + 0x28 + lVar11) = *(undefined4 *)(lVar10 + 0x28 + lVar11);
  *(undefined1 *)(lVar8 + 0x2c + lVar11) = *(undefined1 *)(lVar10 + 0x2c + lVar11);
  *(undefined8 *)(lVar8 + 0x30 + lVar11) = *(undefined8 *)(lVar10 + 0x30 + lVar11);
LAB_00246481:
  (*ppSVar7)[lVar6] = leaveStat;
  return;
}

Assistant:

void SPxSolverBase<R>::rejectLeave(
   int leaveNum,
   SPxId leaveId,
   typename SPxBasisBase<R>::Desc::Status leaveStat,
   const SVectorBase<R>* //newVec
)
{
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   if(leaveId.isSPxRowId())
   {
      SPxOut::debug(this, "DLEAVE58 rejectLeave()  : row {}: {} -> {}\n", leaveNum,
                    ds.rowStatus(leaveNum), leaveStat);

      if(leaveStat == SPxBasisBase<R>::Desc::D_ON_BOTH)
      {
         if(ds.rowStatus(leaveNum) == SPxBasisBase<R>::Desc::P_ON_LOWER)
            theLRbound[leaveNum] = theURbound[leaveNum];
         else
            theURbound[leaveNum] = theLRbound[leaveNum];
      }

      ds.rowStatus(leaveNum) = leaveStat;
   }
   else
   {
      SPxOut::debug(this, "DLEAVE59 rejectLeave()  : col {}: {} -> {}\n", leaveNum,
                    ds.colStatus(leaveNum), leaveStat);

      if(leaveStat == SPxBasisBase<R>::Desc::D_ON_BOTH)
      {
         if(ds.colStatus(leaveNum) == SPxBasisBase<R>::Desc::P_ON_UPPER)
            theLCbound[leaveNum] = theUCbound[leaveNum];
         else
            theUCbound[leaveNum] = theLCbound[leaveNum];
      }

      ds.colStatus(leaveNum) = leaveStat;
   }
}